

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

LY_ERR ly_ctx_unset_searchdir(ly_ctx *ctx,char *value)

{
  ly_set *set;
  uint uVar1;
  lyd_node **pplVar2;
  int iVar3;
  LY_ERR LVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (ctx == (ly_ctx *)0x0) {
    pcVar5 = "ctx";
    ctx = (ly_ctx *)0x0;
  }
  else {
    uVar1 = (ctx->search_paths).count;
    if ((ulong)uVar1 == 0) {
      return LY_SUCCESS;
    }
    set = &ctx->search_paths;
    if (value == (char *)0x0) {
      ly_set_erase(set,free);
      set->size = 0;
      set->count = 0;
      (ctx->search_paths).field_2.dnodes = (lyd_node **)0x0;
      return LY_SUCCESS;
    }
    pplVar2 = (ctx->search_paths).field_2.dnodes;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      iVar3 = strcmp(value,(char *)pplVar2[uVar6]);
      if (iVar3 == 0) {
        if (uVar1 != (uint32_t)uVar6) {
          LVar4 = ly_set_rm_index(set,(uint32_t)uVar6,free);
          return LVar4;
        }
        break;
      }
    }
    pcVar5 = "value";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"ly_ctx_unset_searchdir");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_unset_searchdir(struct ly_ctx *ctx, const char *value)
{
    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    if (!ctx->search_paths.count) {
        return LY_SUCCESS;
    }

    if (value) {
        /* remove specific search directory */
        uint32_t index;

        for (index = 0; index < ctx->search_paths.count; ++index) {
            if (!strcmp(value, ctx->search_paths.objs[index])) {
                break;
            }
        }
        if (index == ctx->search_paths.count) {
            LOGARG(ctx, value);
            return LY_EINVAL;
        } else {
            return ly_set_rm_index(&ctx->search_paths, index, free);
        }
    } else {
        /* remove them all */
        ly_set_erase(&ctx->search_paths, free);
        memset(&ctx->search_paths, 0, sizeof ctx->search_paths);
    }

    return LY_SUCCESS;
}